

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_to_compressed_c.cpp
# Opt level: O3

stb_uint stb_compress(stb_uchar *out,stb_uchar *input,stb_uint length)

{
  bool bVar1;
  stb_uchar *psVar2;
  void *__ptr;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  byte *pbVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  byte *pbVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  stb_uint i;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  stb_uint i_1;
  int iVar23;
  int iVar24;
  byte *pbVar25;
  long lVar26;
  uint local_6c;
  byte *local_68;
  
  stb__out = out;
  __ptr = calloc(1,0x40000);
  iVar24 = (int)out;
  if (__ptr == (void *)0x0) goto LAB_00101fcc;
  if (out == (stb_uchar *)0x0) {
    fputc(0x57,(FILE *)0x0);
    stb__outbytes = stb__outbytes + 1;
    if (stb__out != (stb_uchar *)0x0) goto LAB_00101746;
    fputc(0xbc,(FILE *)0x0);
    stb__outbytes = stb__outbytes + 1;
  }
  else {
    stb__out = out + 1;
    *out = 'W';
LAB_00101746:
    psVar2 = stb__out + 1;
    *stb__out = 0xbc;
    stb__out = psVar2;
  }
  stb_out2(0);
  stb_out4(0);
  stb_out4(length);
  stb_out4(0x40000);
  stb__running_adler = 1;
  pbVar25 = input + length;
  pbVar10 = input;
  uVar21 = 1;
  local_68 = input;
  if (0xc < (int)length) {
    pbVar6 = input + 0xc;
    do {
      iVar24 = (int)pbVar10;
      uVar21 = (int)pbVar25 - iVar24;
      if (pbVar10 + 0x10000 <= pbVar25) {
        uVar21 = 0x10000;
      }
      uVar4 = (ulong)uVar21;
      uVar13 = (uint)pbVar10[2] + (uint)pbVar10[1] * 0x80 + (uint)*pbVar10 * 0x4000;
      uVar5 = (ulong)((uVar13 >> 0x10) + uVar13 & 0x7fff);
      lVar7 = *(long *)((long)__ptr + uVar5 * 8);
      local_6c = 0;
      if ((lVar7 == 0) || (uVar21 == 0)) {
LAB_0010189b:
        uVar18 = 2;
      }
      else {
        uVar18 = 0;
        do {
          uVar19 = uVar18;
          if (*(byte *)(lVar7 + uVar18) != pbVar10[uVar18]) break;
          uVar18 = uVar18 + 1;
          uVar19 = uVar4;
        } while (uVar4 != uVar18);
        uVar17 = (uint)uVar19;
        if ((int)uVar17 < 3) goto LAB_0010189b;
        uVar22 = (long)pbVar10 - lVar7;
        uVar18 = 2;
        if ((long)uVar22 < 0x40001) {
          uVar20 = (uint)uVar22;
          if (((0x100 < (int)uVar20) && (uVar17 < 10)) && ((0x4000 < uVar20 || (uVar17 < 6)))) {
            uVar19 = uVar19 & 0xffffffff;
            if (0x80000 < uVar20 || uVar17 < 8) {
              uVar19 = 2;
            }
            uVar22 = uVar22 & 0xffffffff;
            if (0x80000 < uVar20 || uVar17 < 8) {
              uVar22 = 0;
            }
          }
          uVar18 = uVar19 & 0xffffffff;
          local_6c = (uint)uVar22;
        }
      }
      uVar13 = (uint)pbVar10[4] + (uint)pbVar10[3] * 0x80 + (uVar13 * 0x4000 | uVar13 >> 0x12);
      uVar19 = (ulong)((uVar13 >> 0x10) + uVar13 & 0x7fff);
      lVar7 = *(long *)((long)__ptr + uVar19 * 8);
      if (((lVar7 != 0) && (lVar26 = (long)pbVar10 - lVar7, lVar26 != (int)local_6c)) &&
         (uVar21 != 0)) {
        uVar22 = 0;
        do {
          uVar3 = uVar22;
          if (*(byte *)(lVar7 + uVar22) != pbVar10[uVar22]) break;
          uVar22 = uVar22 + 1;
          uVar3 = uVar4;
        } while (uVar4 != uVar22);
        if ((lVar26 < 0x40001) && (iVar23 = (int)uVar3, (int)uVar18 < iVar23)) {
          uVar21 = (uint)lVar26;
          if ((((int)uVar21 < 0x101) || (9 < iVar23)) || ((uVar21 < 0x4001 && (5 < iVar23)))) {
            uVar18 = uVar3 & 0xffffffff;
            local_6c = uVar21;
          }
          else if (uVar21 < 0x80001 && 7 < iVar23) {
            uVar18 = uVar3 & 0xffffffff;
            local_6c = uVar21;
          }
        }
      }
      uVar21 = (uint)pbVar10[5] * 0x80 + (uint)pbVar10[6] + (uVar13 * 0x4000 | uVar13 >> 0x12);
      uVar13 = (uint)pbVar10[8] + (uVar21 * 0x4000 | uVar21 >> 0x12) + (uint)pbVar10[7] * 0x80;
      uVar3 = (ulong)((uVar13 >> 0x10) + uVar13 & 0x7fff);
      lVar7 = *(long *)((long)__ptr + uVar3 * 8);
      uVar22 = uVar18;
      uVar21 = local_6c;
      if ((lVar7 != 0) && (lVar26 = (long)pbVar10 - lVar7, lVar26 != (int)local_6c)) {
        uVar17 = (uint)lVar26;
        if (uVar4 == 0) {
          if (((int)uVar18 < 0) && (uVar11 = 0, lVar26 < 0x40001)) goto LAB_00101a28;
        }
        else {
          uVar12 = 0;
          do {
            uVar11 = uVar12;
            if (*(byte *)(lVar7 + uVar12) != pbVar10[uVar12]) break;
            uVar12 = uVar12 + 1;
            uVar11 = uVar4;
          } while (uVar4 != uVar12);
          if (((lVar26 < 0x40001) && ((int)uVar18 < (int)uVar11)) &&
             (uVar22 = uVar11, uVar21 = uVar17, (int)uVar11 < 10)) {
LAB_00101a28:
            uVar22 = uVar11;
            uVar21 = uVar17;
            if (((0x100 < (int)uVar17) && ((0x4000 < uVar17 || ((int)uVar11 < 6)))) &&
               (uVar22 = uVar18, uVar21 = local_6c, uVar17 < 0x80001 && 7 < (int)uVar11)) {
              uVar22 = uVar11 & 0xffffffff;
              uVar21 = uVar17;
            }
          }
        }
      }
      local_6c = uVar21;
      uVar21 = (uint)pbVar10[9] * 0x80 + (uint)pbVar10[10] + (uVar13 * 0x4000 | uVar13 >> 0x12);
      uVar21 = (uint)*pbVar6 + (uVar21 * 0x4000 | uVar21 >> 0x12) + (uint)pbVar10[0xb] * 0x80;
      uVar18 = (ulong)((uVar21 >> 0x10) + uVar21 & 0x7fff);
      lVar7 = *(long *)((long)__ptr + uVar18 * 8);
      if ((lVar7 == 0) || (lVar26 = (long)pbVar10 - lVar7, lVar26 == (int)local_6c)) {
LAB_00101aa0:
        uVar11 = uVar22 & 0xffffffff;
        uVar21 = local_6c;
      }
      else {
        uVar21 = (uint)lVar26;
        if (uVar4 == 0) {
          if (((int)uVar22 < 0) && (uVar11 = 0, lVar26 < 0x40001)) {
LAB_00101c12:
            if (((int)uVar21 < 0x101) || ((iVar23 = (int)uVar11, uVar21 < 0x4001 && (5 < iVar23))))
            goto LAB_00101aa3;
            if (uVar21 < 0x80001 && 7 < iVar23) {
              uVar22 = uVar11;
            }
            uVar22 = uVar22 & 0xffffffff;
            if (uVar21 < 0x80001 && 7 < iVar23) {
              local_6c = uVar21;
            }
          }
          goto LAB_00101aa0;
        }
        uVar12 = 0;
        do {
          uVar11 = uVar12;
          if (*(byte *)(lVar7 + uVar12) != pbVar10[uVar12]) break;
          uVar12 = uVar12 + 1;
          uVar11 = uVar4;
        } while (uVar4 != uVar12);
        if ((0x40000 < lVar26) || ((int)uVar11 <= (int)uVar22)) goto LAB_00101aa0;
        if ((int)uVar11 < 10) goto LAB_00101c12;
      }
LAB_00101aa3:
      local_6c = uVar21;
      *(byte **)((long)__ptr + uVar18 * 8) = pbVar10;
      *(byte **)((long)__ptr + uVar3 * 8) = pbVar10;
      *(byte **)((long)__ptr + uVar19 * 8) = pbVar10;
      *(byte **)((long)__ptr + uVar5 * 8) = pbVar10;
      uVar21 = (uint)uVar11;
      if ((2 < (int)uVar21) && ((int)local_6c < 1)) {
        __assert_fail("dist > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/misc/fonts/binary_to_compressed_c.cpp"
                      ,0x125,
                      "int stb_compress_chunk(stb_uchar *, stb_uchar *, stb_uchar *, int, int *, stb_uchar **, stb_uint)"
                     );
      }
      pbVar6 = pbVar10 + 1;
      if ((int)uVar21 < 3) goto LAB_00101cd3;
      iVar23 = (int)local_68;
      if ((uVar21 < 0x81) && ((int)local_6c < 0x101)) {
        outliterals(local_68,iVar24 - iVar23);
        local_68 = pbVar10 + (uVar11 & 0xffffffff);
        if (stb__out == (stb_uchar *)0x0) {
          fputc(uVar21 + 0x7f,(FILE *)0x0);
          stb__outbytes = stb__outbytes + 1;
          if (stb__out == (stb_uchar *)0x0) {
            uVar21 = local_6c - 1 & 0xff;
LAB_00101cc1:
            fputc(uVar21,(FILE *)0x0);
            stb__outbytes = stb__outbytes + 1;
            pbVar6 = local_68;
            goto LAB_00101cd3;
          }
        }
        else {
          *stb__out = (char)uVar11 + '\x7f';
          stb__out = stb__out + 1;
        }
        psVar2 = stb__out + 1;
        *stb__out = (char)local_6c + 0xff;
        stb__out = psVar2;
        pbVar6 = local_68;
      }
      else if ((uVar21 - 6 < 0xfb) && ((int)local_6c < 0x4001)) {
        outliterals(local_68,iVar24 - iVar23);
        stb_out2(local_6c + 0x3fff);
LAB_00101bd4:
        local_68 = pbVar10 + (uVar11 & 0xffffffff);
        if (stb__out == (stb_uchar *)0x0) {
          uVar21 = uVar21 - 1 & 0xff;
          goto LAB_00101cc1;
        }
        psVar2 = stb__out + 1;
        *stb__out = (char)uVar11 + 0xff;
        stb__out = psVar2;
        pbVar6 = local_68;
      }
      else {
        if ((uVar21 - 8 < 0xf9) && ((int)local_6c < 0x80001)) {
          outliterals(local_68,iVar24 - iVar23);
          stb_out3(local_6c + 0x17ffff);
          goto LAB_00101bd4;
        }
        if ((uVar21 - 9 < 0xfff8) && ((int)local_6c < 0x80001)) {
          outliterals(local_68,iVar24 - iVar23);
          local_68 = pbVar10 + (uVar11 & 0xffffffff);
          stb_out3(local_6c + 0xfffff);
LAB_00101cb1:
          stb_out2(uVar21 - 1);
          pbVar6 = local_68;
        }
        else if ((9 < uVar21) && ((int)local_6c < 0x1000001)) {
          uVar5 = 0x10000;
          if (uVar21 < 0x10000) {
            uVar5 = uVar11 & 0xffffffff;
          }
          outliterals(local_68,iVar24 - iVar23);
          local_68 = pbVar10 + uVar5;
          bVar1 = 0x100 < uVar21;
          uVar21 = (uint)uVar5;
          if (bVar1) {
            if (stb__out == (stb_uchar *)0x0) {
              fputc(4,(FILE *)0x0);
              stb__outbytes = stb__outbytes + 1;
            }
            else {
              psVar2 = stb__out + 1;
              *stb__out = '\x04';
              stb__out = psVar2;
            }
            stb_out3(local_6c - 1);
            goto LAB_00101cb1;
          }
          if (stb__out == (stb_uchar *)0x0) {
            fputc(6,(FILE *)0x0);
            stb__outbytes = stb__outbytes + 1;
          }
          else {
            psVar2 = stb__out + 1;
            *stb__out = '\x06';
            stb__out = psVar2;
          }
          stb_out3(local_6c - 1);
          if (stb__out == (stb_uchar *)0x0) {
            uVar21 = uVar21 - 1 & 0xff;
            goto LAB_00101cc1;
          }
          psVar2 = stb__out + 1;
          *stb__out = (char)uVar5 + 0xff;
          stb__out = psVar2;
          pbVar6 = local_68;
        }
      }
LAB_00101cd3:
      pbVar10 = pbVar6;
      uVar21 = stb__running_adler;
    } while ((pbVar10 < input + (int)length) && (pbVar6 = pbVar10 + 0xc, pbVar6 < pbVar25));
  }
  pbVar6 = input + (int)length;
  if ((long)(int)length <= (long)pbVar10 - (long)input) {
    pbVar6 = pbVar10;
  }
  uVar5 = (ulong)(uVar21 >> 0x10);
  uVar4 = (ulong)(uVar21 & 0xffff);
  uVar21 = (int)pbVar6 - (int)input;
  if (uVar21 != 0) {
    uVar18 = (ulong)(uVar21 % 0x15b0);
    uVar13 = uVar21;
    do {
      uVar19 = 0;
      uVar22 = uVar19;
      if (7 < uVar18) {
        do {
          lVar7 = input[uVar22] + uVar4;
          lVar14 = (ulong)input[uVar22 + 1] + lVar7;
          lVar26 = (ulong)input[uVar22 + 2] + lVar14;
          lVar15 = (ulong)input[uVar22 + 3] + lVar26;
          lVar8 = (ulong)input[uVar22 + 4] + lVar15;
          lVar16 = (ulong)input[uVar22 + 5] + lVar8;
          lVar9 = (ulong)input[uVar22 + 6] + lVar16;
          uVar4 = (ulong)input[uVar22 + 7] + lVar9;
          uVar5 = uVar5 + lVar7 + lVar14 + lVar26 + lVar15 + lVar8 + lVar16 + lVar9 + uVar4;
          uVar19 = uVar22 + 8;
          uVar3 = uVar22 + 0xf;
          uVar22 = uVar19;
        } while (uVar3 < uVar18);
        input = input + uVar19;
      }
      lVar7 = uVar18 - uVar19;
      if (uVar19 <= uVar18 && lVar7 != 0) {
        lVar26 = 0;
        do {
          uVar4 = uVar4 + input[lVar26];
          uVar5 = uVar5 + uVar4;
          lVar26 = lVar26 + 1;
        } while (lVar7 != lVar26);
        input = input + lVar7;
      }
      uVar4 = uVar4 % 0xfff1;
      uVar5 = uVar5 % 0xfff1;
      uVar13 = uVar13 - (int)uVar18;
      uVar18 = 0x15b0;
    } while (uVar13 != 0);
  }
  stb__running_adler = (int)uVar4 + (int)uVar5 * 0x10000;
  if (uVar21 != length) {
    __assert_fail("len == length",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/misc/fonts/binary_to_compressed_c.cpp"
                  ,0x16c,"int stb_compress_inner(stb_uchar *, stb_uint)");
  }
  iVar24 = (int)pbVar6 - (int)local_68;
  outliterals(pbVar25 + -(long)iVar24,iVar24);
  free(__ptr);
  stb_out2(0x5fa);
  stb_out4(stb__running_adler);
  iVar24 = (int)stb__out;
LAB_00101fcc:
  return iVar24 - (int)out;
}

Assistant:

stb_uint stb_compress(stb_uchar *out, stb_uchar *input, stb_uint length)
{
    stb__out = out;
    stb__outfile = NULL;

    stb_compress_inner(input, length);

    return stb__out - out;
}